

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(ConvolutionLayerParams *this)

{
  ConvolutionLayerParams *pCVar1;
  ConvolutionLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConvolutionLayerParams_00d55798;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->outputshape_);
  ConvolutionPaddingTypeUnion::ConvolutionPaddingTypeUnion
            ((ConvolutionPaddingTypeUnion *)&this->ConvolutionPaddingType_);
  pCVar1 = internal_default_instance();
  if (this != pCVar1) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

ConvolutionLayerParams::ConvolutionLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ConvolutionLayerParams)
}